

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O3

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_leave_cluster_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _func_int *p_Var3;
  pointer psVar4;
  int iVar5;
  element_type *peVar6;
  undefined8 uVar7;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  undefined1 auVar9 [16];
  ptr<resp_msg> pVar10;
  string local_48;
  
  p_Var3 = req[9].super_msg_base._vptr_msg_base[1];
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  peVar6 = (element_type *)operator_new(0xb0);
  (peVar6->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar6->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005be3a0;
  uVar2 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (peVar6->bg_commit_thread_)._M_id._M_thread = (native_handle_type)p_Var3;
  *(undefined4 *)&(peVar6->bg_append_thread_)._M_id._M_thread = 0xf;
  *(undefined4 *)((long)&(peVar6->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
  *(undefined4 *)&peVar6->bg_append_ea_ = uVar1;
  (peVar6->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_005be3f0;
  (peVar6->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar6->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar6->votes_responded_ = 0;
  peVar6->votes_granted_ = 0;
  (peVar6->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)((long)&(peVar6->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(peVar6->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  *(undefined8 *)((long)&(peVar6->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) = 0
  ;
  *(undefined8 *)((long)&(peVar6->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)&(peVar6->priority_change_timer_).first_event_fired_ = 0;
  (peVar6->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  (peVar6->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar6->priority_change_timer_).duration_us_ = 0;
  *(undefined4 *)&(peVar6->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar6->initialized_ = (__atomic_base<bool>)0x0;
  *(undefined3 *)&peVar6->field_0x31 = 0;
  peVar6->leader_ = (__atomic_base<int>)0x0;
  peVar6->id_ = 0;
  peVar6->my_priority_ = 0;
  *(undefined1 *)&peVar6->target_priority_ = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  this->_vptr_raft_server =
       (_func_int **)
       &(peVar6->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  _Var8._M_pi = extraout_RDX;
  if (*(char *)((long)&req[2].log_entries_.
                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) == '\0') {
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar4 != (pointer)0x0) {
      iVar5 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      if (4 < iVar5) {
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_(&local_48,"leave cluster, set steps to down to 2");
        (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar4,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_leave_cluster_req",0x1c5,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
      }
    }
    *(undefined4 *)((long)&req[4].super_msg_base.term_ + 4) = 2;
    auVar9 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
    _Var8._M_pi = auVar9._8_8_;
    uVar7 = auVar9._0_8_;
    peVar6->initialized_ = (atomic<bool>)(char)uVar7;
    *(int3 *)&peVar6->field_0x31 = (int3)((ulong)uVar7 >> 8);
    peVar6->leader_ = (atomic<int>)(int)((ulong)uVar7 >> 0x20);
    *(undefined1 *)&peVar6->target_priority_ = 1;
  }
  pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_leave_cluster_req(req_msg& req) {
    ptr<resp_msg> resp
        ( cs_new<resp_msg>( state_->get_term(),
                            msg_type::leave_cluster_response,
                            id_,
                            req.get_src() ) );
    if (!config_changing_) {
        p_db("leave cluster, set steps to down to 2");
        // NOTE: We don't call `RemovedFromCluster` callback here,
        //       as cluster config still contains this server.
        //       The callback will be called by either `reconfigure()` (normal path)
        //       or `handle_prevote_resp()` (otherwise).
        //
        //       If this leave cluster message cannot reach quorum,
        //       the new leader's config log (containing this server) will clear
        //       `steps_to_down_` to 0.
        steps_to_down_ = 2;
        resp->accept(log_store_->next_slot());
    }

    return resp;
}